

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O0

lysc_node * lysc_node_child(lysc_node *node)

{
  lysc_node **pplVar1;
  lysc_node **child;
  lysc_node *node_local;
  
  if (node == (lysc_node *)0x0) {
    node_local = (lysc_node *)0x0;
  }
  else if ((node->nodetype & 0x300) == 0) {
    pplVar1 = lysc_node_child_p(node);
    if (pplVar1 == (lysc_node **)0x0) {
      node_local = (lysc_node *)0x0;
    }
    else {
      node_local = *pplVar1;
    }
  }
  else {
    node_local = (lysc_node *)&node[1].module;
  }
  return node_local;
}

Assistant:

lysc_node *
lysc_node_child(const struct lysc_node *node)
{
    struct lysc_node **child;

    if (!node) {
        return NULL;
    }

    if (node->nodetype & (LYS_RPC | LYS_ACTION)) {
        return &((struct lysc_node_action *)node)->input.node;
    } else {
        child = lysc_node_child_p(node);
        if (child) {
            return *child;
        }
    }

    return NULL;
}